

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_each.cpp
# Opt level: O3

void __thiscall tst_helpers_each::delayedFulfilled(tst_helpers_each *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  QArrayData *pQVar3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> this_00;
  bool bVar4;
  compare_eq_result_container<QMap<int,_int>,_int,_int> cVar5;
  undefined8 *puVar6;
  PromiseDataBase<void,_void_()> *this_01;
  PromiseData<QList<int>_> *pPVar7;
  const_iterator expectedBegin;
  QPromiseReject<QList<int>_> *reject;
  initializer_list<std::pair<int,_int>_> list;
  PromiseResolver<QList<int>_> resolver_1;
  QList<int> local_148;
  pair<int,_int> local_130;
  QArrayData *d;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> local_120;
  pair<int,_int> local_118;
  QPromise<QList<int>_> p;
  pair<int,_int> local_100;
  function<void_()> local_f8;
  QSharedData *local_d8;
  QMap<int,_int> values;
  QPromiseBase<QList<int>_> local_c8;
  QMap<int,_int> expected;
  PromiseResolver<void> resolver;
  _Manager_type local_88;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_50;
  code *local_40;
  
  values.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                )(QMapData<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                  *)0x0;
  reject = (QPromiseReject<QList<int>_> *)0x1;
  puVar6 = (undefined8 *)QArrayData::allocate((QArrayData **)&expected,4,8,3,KeepSize);
  *puVar6 = &DAT_2b0000002a;
  *(undefined4 *)(puVar6 + 1) = 0x2c;
  QtPromise::QPromiseBase<QList<int>_>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:255:24),_0>
            (&local_c8,(QList<int> *)&expected);
  this_00.d = local_c8.m_d.d;
  local_c8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001444c8;
  if ((pair<int,_int>)local_c8.m_d.d != (pair<int,_int>)0x0) {
    LOCK();
    (((QSharedData *)((long)local_c8.m_d.d + 8))->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)((long)local_c8.m_d.d + 8))->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_01 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_001446e8;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00144680;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_d8 = &this_01->super_QSharedData;
  local_f8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00144618;
  local_f8.super__Function_base._M_functor._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_f8);
  local_f8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00144660;
  if ((PromiseDataBase<void,_void_()> *)local_f8.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_f8.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_f8.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (**(code **)(*(long *)local_f8.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  if (resolver.m_d.d == (Data *)0x0) {
    d = (QArrayData *)0x0;
    local_148.d.ptr = (int *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    d = (QArrayData *)resolver.m_d.d;
    if (resolver.m_d.d == (Data *)0x0) {
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
           (Data *)0x0;
LAB_001088ad:
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      local_148.d.ptr = (int *)resolver_1.m_d.d;
      if (resolver_1.m_d.d == (Data *)0x0) goto LAB_001088c2;
    }
    else {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
           resolver.m_d.d;
      if (resolver.m_d.d != (Data *)0x0) goto LAB_001088ad;
    }
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_148.d.ptr = (int *)resolver_1.m_d.d;
  }
LAB_001088c2:
  local_148.d.size = (qsizetype)&values;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       local_148.d.ptr;
  local_148.d.d = (Data *)d;
  local_78._M_unused._M_object = operator_new(0x18);
  *(Data **)local_78._M_unused._0_8_ = local_148.d.d;
  if ((pair<int,_int>)local_148.d.d != (pair<int,_int>)0x0) {
    LOCK();
    *(int *)local_148.d.d = *(int *)local_148.d.d + 1;
    UNLOCK();
  }
  *(int **)((long)local_78._M_unused._0_8_ + 8) = local_148.d.ptr;
  if ((pair<int,_int>)local_148.d.ptr == (pair<int,_int>)0x0) {
    ((pair<int,_int> *)((long)local_78._M_unused._0_8_ + 0x10))->first =
         (undefined4)local_148.d.size;
    ((pair<int,_int> *)((long)local_78._M_unused._0_8_ + 0x10))->second = local_148.d.size._4_4_;
    pcStack_60 = std::
                 _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *local_148.d.ptr = *local_148.d.ptr + 1;
    UNLOCK();
    ((pair<int,_int> *)((long)local_78._M_unused._0_8_ + 0x10))->first =
         (undefined4)local_148.d.size;
    ((pair<int,_int> *)((long)local_78._M_unused._0_8_ + 0x10))->second = local_148.d.size._4_4_;
    pcStack_60 = std::
                 _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
    if ((pair<int,_int>)local_148.d.ptr != (pair<int,_int>)0x0) {
      LOCK();
      *local_148.d.ptr = *local_148.d.ptr + -1;
      UNLOCK();
      if (*local_148.d.ptr == 0) {
        operator_delete(local_148.d.ptr,0x10);
      }
    }
  }
  if ((pair<int,_int>)local_148.d.d != (pair<int,_int>)0x0) {
    LOCK();
    *(int *)local_148.d.d = *(int *)local_148.d.d + -1;
    UNLOCK();
    if (*(int *)local_148.d.d == 0) {
      operator_delete(local_148.d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            (&(this_00.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,
             (function<void_(const_QList<int>_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&d,
             (QPromiseResolve<void> *)&resolver_1,(QPromiseReject<void> *)reject);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            (&(this_00.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  if (d != (QArrayData *)0x0) {
    LOCK();
    (d->ref_)._q_value.super___atomic_base<int>._M_i =
         (d->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((d->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar4 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    (&(this_00.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
              (&(this_00.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
  }
  LOCK();
  (((QSharedData *)((long)this_00.d + 8))->ref).super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
       (((QSharedData *)((long)this_00.d + 8))->ref).super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar1 = (QSharedData *)((long)this_00.d + 8);
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00144498;
  pPVar7 = (PromiseData<QList<int>_> *)operator_new(0x68);
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar7->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled =
       0;
  (pPVar7->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00144578;
  QReadWriteLock::QReadWriteLock
            (&(pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock,0);
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = false;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_00144500;
  (pPVar7->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar7->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar2 = &(pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData
  ;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar7 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar7->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  d = (QArrayData *)&PTR__QPromiseBase_001444c8;
  local_120.d = pPVar7;
  p.super_QPromiseBase<QList<int>_>.m_d.d = pPVar7;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver_1,(QPromise<QList<int>_> *)&d);
  d = (QArrayData *)&PTR__QPromiseBase_00144498;
  if (local_120.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar2 = &((local_120.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_120.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((local_120.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_100.first = 0;
    local_100.second = 0;
    local_118.first = 0;
    local_118.second = 0;
    goto LAB_00108bfe;
  }
  LOCK();
  *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
  UNLOCK();
  local_100 = (pair<int,_int>)resolver_1.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_118.first = 0;
    local_118.second = 0;
LAB_00108be9:
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    if (local_118 == (pair<int,_int>)0x0) goto LAB_00108bfe;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_118 = (pair<int,_int>)resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) goto LAB_00108be9;
  }
  LOCK();
  *(int *)local_118 = *(int *)local_118 + 1;
  UNLOCK();
LAB_00108bfe:
  local_130 = (pair<int,_int>)this_00.d;
  LOCK();
  (((QSharedData *)((long)this_00.d + 8))->ref).super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
       (((QSharedData *)((long)this_00.d + 8))->ref).super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_148.d.size = (qsizetype)&PTR__QPromiseBase_001444c8;
  local_f8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_f8.super__Function_base._M_functor._8_8_ = 0;
  local_f8.super__Function_base._M_manager = (_Manager_type)0x0;
  local_f8._M_invoker = (_Invoker_type)0x0;
  local_148.d.d = (Data *)local_100;
  local_148.d.ptr = (int *)local_118;
  local_f8.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(Data **)local_f8.super__Function_base._M_functor._M_unused._0_8_ = local_148.d.d;
  if ((pair<int,_int>)local_148.d.d != (pair<int,_int>)0x0) {
    LOCK();
    *(int *)local_148.d.d = *(int *)local_148.d.d + 1;
    UNLOCK();
  }
  *(int **)((long)local_f8.super__Function_base._M_functor._M_unused._0_8_ + 8) = local_148.d.ptr;
  if ((pair<int,_int>)local_148.d.ptr != (pair<int,_int>)0x0) {
    LOCK();
    *local_148.d.ptr = *local_148.d.ptr + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_f8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_00144498;
  *(pair<int,_int> *)((long)local_f8.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
       local_130;
  if (local_130 == (pair<int,_int>)0x0) {
    *(undefined ***)((long)local_f8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         &PTR__QPromiseBase_001444c8;
    local_f8._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_invoke;
    local_f8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_manager;
    local_148.d.size = (qsizetype)&PTR__QPromiseBase_00144498;
  }
  else {
    LOCK();
    (((QSharedData *)((long)local_130 + 8))->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)((long)local_130 + 8))->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(undefined ***)((long)local_f8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         &PTR__QPromiseBase_001444c8;
    local_f8._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_invoke;
    local_f8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_manager;
    local_148.d.size = (qsizetype)&PTR__QPromiseBase_00144498;
    if (local_130 != (pair<int,_int>)0x0) {
      LOCK();
      pQVar2 = (QSharedData *)((long)local_130 + 8);
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (local_130 != (pair<int,_int>)0x0)) {
        (**(code **)(*(long *)local_130 + 8))();
      }
    }
  }
  if ((pair<int,_int>)local_148.d.ptr != (pair<int,_int>)0x0) {
    LOCK();
    *local_148.d.ptr = *local_148.d.ptr + -1;
    UNLOCK();
    if (*local_148.d.ptr == 0) {
      operator_delete(local_148.d.ptr,0x10);
    }
  }
  if ((pair<int,_int>)local_148.d.d != (pair<int,_int>)0x0) {
    LOCK();
    *(int *)local_148.d.d = *(int *)local_148.d.d + -1;
    UNLOCK();
    if (*(int *)local_148.d.d == 0) {
      operator_delete(local_148.d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler(this_01,&local_f8);
  if (local_f8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_f8.super__Function_base._M_manager)
              ((_Any_data *)&local_f8,(_Any_data *)&local_f8,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_100,
             (QPromiseResolve<QList<int>_> *)&local_118,reject);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (this_01,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  if (local_88 != (_Manager_type)0x0) {
    (*local_88)((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  }
  if (local_118 != (pair<int,_int>)0x0) {
    LOCK();
    *(int *)local_118 = *(int *)local_118 + -1;
    UNLOCK();
    if (*(int *)local_118 == 0) {
      operator_delete((void *)local_118,0x10);
    }
  }
  if (local_100 != (pair<int,_int>)0x0) {
    LOCK();
    *(int *)local_100 = *(int *)local_100 + -1;
    UNLOCK();
    if (*(int *)local_100 == 0) {
      operator_delete((void *)local_100,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001444c8;
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_01);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (**(code **)(*(long *)this_00.d + 8))(this_00.d);
  }
  LOCK();
  (local_d8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_d8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_d8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (**(code **)(*(long *)this_00.d + 8))(this_00.d);
  }
  local_c8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00144498;
  if ((pair<int,_int>)local_c8.m_d.d != (pair<int,_int>)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)((long)local_c8.m_d.d + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((pair<int,_int>)local_c8.m_d.d != (pair<int,_int>)0x0)) {
      (**(code **)(*(long *)local_c8.m_d.d + 8))();
    }
  }
  if (expected.d.d !=
      (QMapData<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_> *)
      0x0) {
    LOCK();
    *(int *)expected.d.d = *(int *)expected.d.d + -1;
    UNLOCK();
    if (*(int *)expected.d.d == 0) {
      QArrayData::deallocate((QArrayData *)expected.d.d,4,8);
    }
  }
  expected.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                  )(QMapData<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                    *)0x0;
  waitForValue<QList<int>>(&local_148,&p,(QList<int> *)&expected);
  expectedBegin.i = (int *)QArrayData::allocate(&d,4,8,3,KeepSize);
  pQVar3 = d;
  *(undefined1 **)expectedBegin.i = &DAT_2b0000002a;
  expectedBegin.i[2] = 0x2c;
  bVar4 = QTest::_q_compareSequence<QList<int>::const_iterator,QList<int>::const_iterator>
                    ((const_iterator)local_148.d.ptr,
                     (const_iterator)(local_148.d.ptr + local_148.d.size * 4),expectedBegin,
                     (const_iterator)(expectedBegin.i + 3),"waitForValue(p, QVector<int>{})",
                     "(QVector<int>{42, 43, 44})",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_each.cpp"
                     ,0x65);
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,4,8);
    }
  }
  if ((pair<int,_int>)local_148.d.d != (pair<int,_int>)0x0) {
    LOCK();
    *(int *)local_148.d.d = *(int *)local_148.d.d + -1;
    UNLOCK();
    if (*(int *)local_148.d.d == 0) {
      QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,4,8);
    }
  }
  if (expected.d.d !=
      (QMapData<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_> *)
      0x0) {
    LOCK();
    *(int *)expected.d.d = *(int *)expected.d.d + -1;
    UNLOCK();
    if (*(int *)expected.d.d == 0) {
      QArrayData::deallocate((QArrayData *)expected.d.d,4,8);
    }
  }
  if (bVar4) {
    local_148.d.d = (Data *)0x2a;
    local_148.d.ptr = (int *)0x10000002b;
    local_148.d.size = 0x20000002c;
    list._M_len = 3;
    list._M_array = (iterator)&local_148;
    QMap<int,_int>::QMap(&expected,list);
    cVar5 = operator==(&values,&expected);
    QTest::compare_helper
              (cVar5,"Compared values are not the same",(char *)0x0,(char *)0x0,"values","expected",
               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_each.cpp"
               ,0x67);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&expected.d);
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00144498;
  if (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&values.d);
  return;
}

Assistant:

void tst_helpers_each::preserveValues()
{
    QVector<int> values;
    auto p = QtPromise::each(QVector<int>{42, 43, 44}, [&](int v, ...) {
        values << v + 1;
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{42, 43, 44}));
    QCOMPARE(values, (QVector<int>{43, 44, 45}));
}